

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

void __thiscall
TestChain100Setup::MockMempoolMinFee(TestChain100Setup *this,CFeeRate *target_feerate)

{
  LockPoints lp_00;
  undefined1 uVar1;
  bool bVar2;
  CTxMemPool *this_00;
  vector<COutPoint,_std::allocator<COutPoint>_> *pvNoSpendsRemaining;
  CScript *fee;
  int64_t iVar3;
  pointer this_01;
  size_t in_RDI;
  long in_FS_OFFSET;
  CAmount tx_fee;
  LockPoints lp;
  CTransactionRef tx;
  CMutableTransaction mtx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 uVar4;
  uint32_t in_stack_fffffffffffffc1c;
  CMutableTransaction *in_stack_fffffffffffffc20;
  CTxMemPool *this_02;
  CTxMemPool *in_stack_fffffffffffffc28;
  COutPoint *in_stack_fffffffffffffc30;
  uint32_t num_bytes;
  CScript *in_stack_fffffffffffffc38;
  WitnessV0ScriptHash *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  opcodetype in_stack_fffffffffffffc4c;
  CTxMemPoolEntry *in_stack_fffffffffffffc50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffc58;
  undefined1 spends_coinbase;
  undefined1 *entry_sequence;
  uint entry_height;
  undefined8 *time;
  CTransactionRef *tx_00;
  CTxMemPoolEntry *this_03;
  undefined7 in_stack_fffffffffffffcd8;
  CFeeRate *local_2c0;
  CTransactionRef local_290;
  undefined1 local_278 [336];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_e0 [116];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffc58,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc50,
             (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             (char *)in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffc38 >> 0x18,0));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  this_00 = (CTxMemPool *)
            MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)
                       CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffc58,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc50,
             (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             (char *)in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffc38 >> 0x18,0));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  pvNoSpendsRemaining =
       (vector<COutPoint,_std::allocator<COutPoint>_> *)CTxMemPool::size(in_stack_fffffffffffffc28);
  if (pvNoSpendsRemaining != (vector<COutPoint,_std::allocator<COutPoint>_> *)0x0) {
    __assert_fail("m_node.mempool->size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x22b,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  uVar1 = operator>((CFeeRate *)in_stack_fffffffffffffc28,(CFeeRate *)in_stack_fffffffffffffc20);
  if (!(bool)uVar1) {
    __assert_fail("target_feerate > m_node.mempool->m_opts.incremental_relay_feerate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x22e,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  bVar2 = operator>((CFeeRate *)in_stack_fffffffffffffc28,(CFeeRate *)in_stack_fffffffffffffc20);
  if (!bVar2) {
    __assert_fail("target_feerate > m_node.mempool->m_opts.min_relay_feerate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x230,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  tx_00 = &local_290;
  this_03 = (CTxMemPoolEntry *)&stack0xffffffffffffff94;
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)
             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  transaction_identifier<false>::FromUint256
            ((uint256 *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  COutPoint::COutPoint
            ((COutPoint *)in_stack_fffffffffffffc28,(Txid *)in_stack_fffffffffffffc20,
             in_stack_fffffffffffffc1c);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffc38,
             in_stack_fffffffffffffc30);
  entry_height = (uint)((ulong)local_278 >> 0x20);
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  time = &local_128;
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  fee = CScript::operator<<((CScript *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
  WitnessV0ScriptHash::WitnessV0ScriptHash(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  entry_sequence = local_e0;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffc28,(WitnessV0ScriptHash *)in_stack_fffffffffffffc20);
  GetScriptForDestination
            ((CTxDestination *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffc38,
             (long *)in_stack_fffffffffffffc30,(CScript *)in_stack_fffffffffffffc28);
  num_bytes = (uint32_t)((ulong)in_stack_fffffffffffffc30 >> 0x20);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffc20);
  LockPoints::LockPoints
            ((LockPoints *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffc28);
  iVar3 = GetVirtualTransactionSize
                    ((CTransaction *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  spends_coinbase = (undefined1)((ulong)iVar3 >> 0x38);
  CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffc38,num_bytes);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffc28);
  GetVirtualTransactionSize
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffc38,num_bytes);
  this_01 = std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
                      ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                       CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  this_02 = (CTxMemPool *)0x1;
  uVar4 = 1;
  lp_00.time = in_RDI;
  lp_00._0_8_ = pvNoSpendsRemaining;
  lp_00.maxInputBlock = (CBlockIndex *)this_00;
  CTxMemPoolEntry::CTxMemPoolEntry
            (this_03,tx_00,(CAmount)fee,(int64_t)time,entry_height,(uint64_t)entry_sequence,
             (bool)spends_coinbase,CONCAT17(uVar1,in_stack_fffffffffffffcd8),lp_00);
  CTxMemPool::addUnchecked(this_01,in_stack_fffffffffffffc50);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffc1c,uVar4));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,uVar4));
  CTxMemPool::TrimToSize(this_00,in_RDI,pvNoSpendsRemaining);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,uVar4));
  CTxMemPool::GetMinFee(this_02);
  bVar2 = ::operator==(local_2c0,(CFeeRate *)this_02);
  if (!bVar2) {
    __assert_fail("m_node.mempool->GetMinFee() == target_feerate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x240,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)CONCAT44(in_stack_fffffffffffffc1c,uVar4));
  CMutableTransaction::~CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffc1c,uVar4));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,uVar4));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,uVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestChain100Setup::MockMempoolMinFee(const CFeeRate& target_feerate)
{
    LOCK2(cs_main, m_node.mempool->cs);
    // Transactions in the mempool will affect the new minimum feerate.
    assert(m_node.mempool->size() == 0);
    // The target feerate cannot be too low...
    // ...otherwise the transaction's feerate will need to be negative.
    assert(target_feerate > m_node.mempool->m_opts.incremental_relay_feerate);
    // ...otherwise this is not meaningful. The feerate policy uses the maximum of both feerates.
    assert(target_feerate > m_node.mempool->m_opts.min_relay_feerate);

    // Manually create an invalid transaction. Manually set the fee in the CTxMemPoolEntry to
    // achieve the exact target feerate.
    CMutableTransaction mtx = CMutableTransaction();
    mtx.vin.emplace_back(COutPoint{Txid::FromUint256(m_rng.rand256()), 0});
    mtx.vout.emplace_back(1 * COIN, GetScriptForDestination(WitnessV0ScriptHash(CScript() << OP_TRUE)));
    const auto tx{MakeTransactionRef(mtx)};
    LockPoints lp;
    // The new mempool min feerate is equal to the removed package's feerate + incremental feerate.
    const auto tx_fee = target_feerate.GetFee(GetVirtualTransactionSize(*tx)) -
        m_node.mempool->m_opts.incremental_relay_feerate.GetFee(GetVirtualTransactionSize(*tx));
    m_node.mempool->addUnchecked(CTxMemPoolEntry(tx, /*fee=*/tx_fee,
                                                 /*time=*/0, /*entry_height=*/1, /*entry_sequence=*/0,
                                                 /*spends_coinbase=*/true, /*sigops_cost=*/1, lp));
    m_node.mempool->TrimToSize(0);
    assert(m_node.mempool->GetMinFee() == target_feerate);
}